

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::BeginGreedyLoopNoBacktrackInst::Exec
          (BeginGreedyLoopNoBacktrackInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  int iVar1;
  CharCount CVar2;
  Label LVar3;
  LoopInfo *pLVar4;
  PageAllocation *pPVar5;
  code *pcVar6;
  bool bVar7;
  undefined4 *puVar8;
  size_t sVar9;
  long lVar10;
  
  iVar1 = (this->super_GreedyLoopNoBacktrackMixin).loopId;
  lVar10 = (long)iVar1;
  if ((lVar10 < 0) || (((matcher->program).ptr)->numLoops <= iVar1)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x77b,"(loopId >= 0 && loopId < program->numLoops)",
                       "loopId >= 0 && loopId < program->numLoops");
    if (!bVar7) goto LAB_00efabf2;
    *puVar8 = 0;
  }
  pLVar4 = (matcher->loopInfos).ptr;
  pLVar4[lVar10].number = 0;
  pLVar4[lVar10].startInputOffset = *inputOffset;
  sVar9 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
          super_ContinuousPageStack<1UL>.bufferSize;
  if (sVar9 - (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
              super_ContinuousPageStack<1UL>.nextTop < 0x20) {
    ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x20);
    sVar9 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
            super_ContinuousPageStack<1UL>.bufferSize;
  }
  if (sVar9 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                       ,199,"(bufferSize)","bufferSize");
    if (!bVar7) {
LAB_00efabf2:
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar8 = 0;
  }
  pPVar5 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
           super_ContinuousPageStack<1UL>.pageAllocation;
  sVar9 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
          super_ContinuousPageStack<1UL>.nextTop;
  (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
  super_ContinuousPageStack<1UL>.nextTop = sVar9 + 0x20;
  *(size_t *)((long)&pPVar5[1].pageCount + sVar9) =
       (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
       topElementSize;
  (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).topElementSize =
       0x20;
  CVar2 = *inputOffset;
  LVar3 = (this->super_GreedyLoopNoBacktrackMixin).exitLabel;
  *(undefined1 *)((long)&pPVar5[2].pageCount + sVar9) = 0;
  *(undefined ***)((long)&pPVar5[1].segment + sVar9) = &PTR_Print_015432a8;
  *(CharCount *)((long)&pPVar5[2].pageCount + sVar9 + 4) = CVar2;
  *(Label *)((long)&pPVar5[2].segment + sVar9) = LVar3;
  *instPointer = *instPointer + 9;
  Matcher::PushStats(matcher,contStack,input);
  return false;
}

Assistant:

inline bool BeginGreedyLoopNoBacktrackInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(loopId);

        loopInfo->number = 0;
        loopInfo->startInputOffset = inputOffset;

        // CHOICEPOINT: Try one iteration of body, if backtrack continue from here with no iterations
        PUSH(contStack, ResumeCont, inputOffset, exitLabel);
        instPointer += sizeof(*this);
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.PushStats(contStack, input);
#endif

        return false;
    }